

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int remain;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  uint uVar22;
  uint h;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  void *local_68;
  
  uVar19._0_4_ = bottom_blob->w;
  uVar19._4_4_ = bottom_blob->h;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar19;
  uVar22 = this->output_width;
  h = this->output_height;
  bVar21 = bottom_blob->dims == 1;
  if (!bVar21) {
    uVar19 = (ulong)(uint)bottom_blob->c;
  }
  uVar10 = (uint)bVar21;
  auVar28._0_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar28._4_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar28._8_8_ = 0;
  auVar29._0_4_ = auVar28._0_4_ >> 0x1f;
  auVar29._4_4_ = auVar28._4_4_ >> 0x1f;
  auVar29._8_8_ = 0;
  auVar29 = auVar29 | ~auVar28 & auVar27;
  auVar24._0_4_ = -(uint)(uVar22 == 0);
  auVar24._4_4_ = -(uint)(uVar22 == 0);
  auVar24._8_4_ = -(uint)(h == 0);
  auVar24._12_4_ = -(uint)(h == 0);
  iVar11 = movmskpd(uVar10,auVar24);
  uVar10 = auVar29._0_4_;
  uVar30 = auVar29._4_4_;
  if (iVar11 != 0) {
    uVar2 = this->width_scale;
    uVar3 = this->height_scale;
    uVar22 = (uint)((float)uVar2 * (float)(int)uVar10);
    h = (uint)((float)uVar3 * (float)(int)uVar30);
  }
  auVar25._0_4_ = -(uint)(uVar22 == uVar10);
  auVar25._4_4_ = auVar25._0_4_;
  auVar25._8_4_ = -(uint)(h == uVar30);
  auVar25._12_4_ = -(uint)(h == uVar30);
  iVar11 = movmskpd(iVar11,auVar25);
  if (iVar11 == 3) {
    iVar11 = 0;
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if ((*piVar4 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      iVar18 = bottom_blob->w;
      iVar15 = bottom_blob->h;
      iVar9 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar18;
      top_blob->h = iVar15;
      top_blob->c = iVar9;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar18 = (int)uVar19;
    auVar26._0_4_ = -(uint)(top_blob->dims == 3);
    auVar26._4_4_ = -(uint)(uVar22 == top_blob->w);
    auVar26._8_4_ = -(uint)(h == top_blob->h);
    auVar26._12_4_ = -(uint)(iVar18 == top_blob->c);
    iVar11 = movmskps(iVar11,auVar26);
    if ((iVar11 != 0xf) || (top_blob->elemsize != 4)) {
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if ((*piVar4 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 4;
      top_blob->dims = 3;
      top_blob->w = uVar22;
      top_blob->h = h;
      top_blob->c = iVar18;
      uVar13 = (long)(int)(h * uVar22) + 3U & 0x3ffffffffffffffc;
      top_blob->cstep = uVar13;
      lVar20 = (long)iVar18 * uVar13;
      if (lVar20 != 0) {
        pvVar12 = malloc(lVar20 * 4 + 0x1c);
        pvVar14 = (void *)((long)pvVar12 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar14 - 8) = pvVar12;
        top_blob->data = pvVar14;
        piVar4 = (int *)((long)pvVar14 + lVar20 * 4);
        top_blob->refcount = piVar4;
        *piVar4 = 1;
      }
    }
    auVar28 = _DAT_001334a0;
    auVar24 = _DAT_00133490;
    auVar27 = _DAT_00133420;
    iVar11 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (bottom_blob->dims == 1) {
        if (0 < iVar18) {
          sVar5 = top_blob->cstep;
          uVar22 = top_blob->h * top_blob->w;
          pvVar12 = bottom_blob->data;
          lVar20 = (ulong)uVar22 - 1;
          auVar23._8_4_ = (int)lVar20;
          auVar23._0_8_ = lVar20;
          auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
          lVar20 = (long)top_blob->data + 0xc;
          sVar6 = top_blob->elemsize;
          uVar13 = 0;
          auVar23 = auVar23 ^ _DAT_00133420;
          do {
            if (0 < (int)uVar22) {
              uVar1 = *(undefined4 *)((long)pvVar12 + uVar13 * 4);
              uVar17 = 0;
              do {
                auVar31._8_4_ = (int)uVar17;
                auVar31._0_8_ = uVar17;
                auVar31._12_4_ = (int)(uVar17 >> 0x20);
                auVar29 = (auVar31 | auVar28) ^ auVar27;
                iVar11 = auVar23._4_4_;
                if ((bool)(~(iVar11 < auVar29._4_4_ ||
                            auVar23._0_4_ < auVar29._0_4_ && auVar29._4_4_ == iVar11) & 1)) {
                  *(undefined4 *)(lVar20 + -0xc + uVar17 * 4) = uVar1;
                }
                if (auVar29._12_4_ <= auVar23._12_4_ &&
                    (auVar29._8_4_ <= auVar23._8_4_ || auVar29._12_4_ != auVar23._12_4_)) {
                  *(undefined4 *)(lVar20 + -8 + uVar17 * 4) = uVar1;
                }
                auVar29 = (auVar31 | auVar24) ^ auVar27;
                iVar18 = auVar29._4_4_;
                if (iVar18 <= iVar11 && (iVar18 != iVar11 || auVar29._0_4_ <= auVar23._0_4_)) {
                  *(undefined4 *)(lVar20 + -4 + uVar17 * 4) = uVar1;
                  *(undefined4 *)(lVar20 + uVar17 * 4) = uVar1;
                }
                uVar17 = uVar17 + 4;
              } while ((uVar22 + 3 & 0xfffffffc) != uVar17);
            }
            uVar13 = uVar13 + 1;
            lVar20 = lVar20 + sVar5 * sVar6;
          } while (uVar13 != (uVar19 & 0xffffffff));
        }
      }
      else if (this->resize_type == 2) {
        resize_bilinear(bottom_blob,top_blob,uVar22,h);
      }
      else {
        if (this->resize_type != 1) {
          forward();
          return -0xe9;
        }
        if (0 < iVar18) {
          sVar5 = bottom_blob->cstep;
          sVar6 = bottom_blob->elemsize;
          pvVar12 = bottom_blob->data;
          local_68 = top_blob->data;
          sVar7 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          uVar13 = 0;
          do {
            if (0 < (int)h) {
              uVar17 = 0;
              pvVar14 = local_68;
              do {
                if (0 < (int)uVar22) {
                  iVar11 = (int)((float)(int)uVar17 / this->height_scale);
                  if ((int)(uVar30 - 1) < iVar11) {
                    iVar11 = uVar30 - 1;
                  }
                  uVar16 = 0;
                  do {
                    iVar15 = (int)((float)(int)uVar16 / this->width_scale);
                    iVar18 = uVar10 - 1;
                    if (iVar15 <= (int)(uVar10 - 1)) {
                      iVar18 = iVar15;
                    }
                    *(undefined4 *)((long)pvVar14 + uVar16 * 4) =
                         *(undefined4 *)
                          ((long)pvVar12 +
                          (long)(int)(iVar18 + iVar11 * uVar10) * 4 + sVar5 * sVar6 * uVar13);
                    uVar16 = uVar16 + 1;
                  } while (uVar22 != uVar16);
                }
                uVar17 = uVar17 + 1;
                pvVar14 = (void *)((long)pvVar14 + (ulong)uVar22 * 4);
              } while (uVar17 != h);
            }
            uVar13 = uVar13 + 1;
            local_68 = (void *)((long)local_68 + sVar7 * sVar8);
          } while (uVar13 != (uVar19 & 0xffffffff));
          return 0;
        }
      }
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}